

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.c
# Opt level: O2

void aes_ecb4x(uchar *out,uint32_t *ivw,uint64_t *sk_exp,uint nrounds)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  uint64_t *puVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  uint64_t q [8];
  uint32_t w [16];
  
  puVar4 = q;
  w._0_8_ = *(undefined8 *)ivw;
  w._8_8_ = *(undefined8 *)(ivw + 2);
  w._16_8_ = *(undefined8 *)(ivw + 4);
  w._24_8_ = *(undefined8 *)(ivw + 6);
  w._32_8_ = *(undefined8 *)(ivw + 8);
  w._40_8_ = *(undefined8 *)(ivw + 10);
  w._48_8_ = *(undefined8 *)(ivw + 0xc);
  w._56_8_ = *(undefined8 *)(ivw + 0xe);
  for (lVar5 = 0; lVar5 != 0x40; lVar5 = lVar5 + 0x10) {
    br_aes_ct64_interleave_in(puVar4,puVar4 + 4,(uint32_t *)((long)w + lVar5));
    puVar4 = puVar4 + 1;
  }
  br_aes_ct64_ortho(q);
  add_round_key(q,sk_exp);
  puVar4 = sk_exp + 8;
  uVar8 = 1;
  while( true ) {
    br_aes_ct64_bitslice_Sbox(q);
    shift_rows(q);
    if (nrounds <= uVar8) break;
    uVar3 = q[0] << 0x30 | q[0] >> 0x10;
    uVar1 = q[7] << 0x30 | q[7] >> 0x10;
    uVar2 = q[7] ^ uVar1;
    uVar6 = q[0] ^ uVar3;
    q[0] = uVar3 ^ uVar2 ^ (uVar6 << 0x20 | uVar6 >> 0x20);
    uVar7 = q[1] << 0x30 | q[1] >> 0x10;
    uVar3 = q[1] ^ uVar7;
    q[1] = uVar2 ^ uVar6 ^ uVar7 ^ (uVar3 << 0x20 | uVar3 >> 0x20);
    uVar6 = q[2] << 0x30 | q[2] >> 0x10;
    uVar7 = q[2] ^ uVar6;
    q[2] = uVar3 ^ uVar6 ^ (uVar7 << 0x20 | uVar7 >> 0x20);
    uVar6 = q[3] << 0x30 | q[3] >> 0x10;
    uVar3 = q[3] ^ uVar6;
    q[3] = uVar2 ^ uVar7 ^ uVar6 ^ (uVar3 << 0x20 | uVar3 >> 0x20);
    uVar6 = q[4] << 0x30 | q[4] >> 0x10;
    uVar7 = q[4] ^ uVar6;
    q[4] = uVar2 ^ uVar3 ^ uVar6 ^ (uVar7 << 0x20 | uVar7 >> 0x20);
    uVar3 = q[5] << 0x30 | q[5] >> 0x10;
    uVar6 = q[5] ^ uVar3;
    q[5] = uVar7 ^ uVar3 ^ (uVar6 << 0x20 | uVar6 >> 0x20);
    uVar3 = q[6] << 0x30 | q[6] >> 0x10;
    uVar7 = q[6] ^ uVar3;
    q[6] = uVar6 ^ uVar3 ^ (uVar7 << 0x20 | uVar7 >> 0x20);
    q[7] = (uVar2 << 0x20 | uVar2 >> 0x20) ^ uVar1 ^ uVar7;
    add_round_key(q,puVar4);
    uVar8 = uVar8 + 1;
    puVar4 = puVar4 + 8;
  }
  add_round_key(q,sk_exp + (nrounds << 3));
  br_aes_ct64_ortho(q);
  for (lVar5 = 0; lVar5 != 0x20; lVar5 = lVar5 + 8) {
    uVar8 = *(ulong *)((long)q + lVar5);
    uVar3 = *(ulong *)((long)q + lVar5 + 0x20);
    uVar7 = uVar8 & 0xff000000ff00 | uVar8 >> 8 & 0xff000000ff0000;
    uVar6 = uVar3 & 0xff000000ff00 | uVar3 >> 8 & 0xff000000ff0000;
    uVar8 = ((uVar8 & 0xff00ff00ff00ff) >> 8 | uVar8 & 0xff00ff00ff00ff) & 0xffff0000ffff;
    uVar3 = ((uVar3 & 0xff00ff00ff00ff) >> 8 | uVar3 & 0xff00ff00ff00ff) & 0xffff0000ffff;
    *(ulong *)((long)w + lVar5 * 2) =
         CONCAT44((uint)(uVar3 >> 0x10) | (uint)uVar3,(uint)(uVar8 >> 0x10) | (uint)uVar8);
    *(uint *)((long)w + lVar5 * 2 + 8) = (uint)(uVar7 >> 8) | (uint)(uVar7 >> 0x18);
    *(uint *)((long)w + lVar5 * 2 + 0xc) = (uint)(uVar6 >> 8) | (uint)(uVar6 >> 0x18);
  }
  for (lVar5 = 0; lVar5 != 0x10; lVar5 = lVar5 + 1) {
    *(uint32_t *)(out + lVar5 * 4) = w[lVar5];
  }
  return;
}

Assistant:

static void aes_ecb4x(unsigned char out[64], const uint32_t ivw[16], const uint64_t *sk_exp, unsigned int nrounds) {
    uint32_t w[16];
    uint64_t q[8];
    unsigned int i;

    memcpy(w, ivw, sizeof(w));
    for (i = 0; i < 4; i++) {
        br_aes_ct64_interleave_in(&q[i], &q[i + 4], w + (i << 2));
    }
    br_aes_ct64_ortho(q);


    add_round_key(q, sk_exp);
    for (i = 1; i < nrounds; i++) {
        br_aes_ct64_bitslice_Sbox(q);
        shift_rows(q);
        mix_columns(q);
        add_round_key(q, sk_exp + (i << 3));
    }
    br_aes_ct64_bitslice_Sbox(q);
    shift_rows(q);
    add_round_key(q, sk_exp + 8 * nrounds);

    br_aes_ct64_ortho(q);
    for (i = 0; i < 4; i ++) {
        br_aes_ct64_interleave_out(w + (i << 2), q[i], q[i + 4]);
    }
    br_range_enc32le(out, w, 16);
}